

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolvmin.cpp
# Opt level: O2

bool __thiscall chrono::ChOptimizerGenetic::InitializePopulation(ChOptimizerGenetic *this)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  uint uVar4;
  Scalar *pSVar5;
  long lVar6;
  ulong index;
  undefined1 auVar7 [64];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 extraout_var [56];
  
  uVar4 = (*(this->super_ChOptimizer)._vptr_ChOptimizer[7])();
  if ((this->population == (ChGenotype **)0x0) ||
     (((*this->population)->genes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
      m_storage.m_rows != (long)(int)uVar4)) {
    bVar3 = false;
  }
  else {
    for (lVar6 = 0; lVar6 < *(int *)&(this->super_ChOptimizer).field_0x144; lVar6 = lVar6 + 1) {
      this->population[lVar6]->need_eval = true;
      for (index = 0; (~((int)uVar4 >> 0x1f) & uVar4) != index; index = index + 1) {
        dVar1 = (this->super_ChOptimizer).xv_inf[index];
        dVar2 = (this->super_ChOptimizer).xv_sup[index];
        auVar7._0_8_ = ChRandom();
        auVar7._8_56_ = extraout_var;
        auVar9._8_8_ = 0;
        auVar9._0_8_ = dVar1;
        auVar8._8_8_ = 0;
        auVar8._0_8_ = dVar2 - dVar1;
        auVar8 = vfmadd213sd_fma(auVar8,auVar7._0_16_,auVar9);
        pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                            this->population[lVar6],index);
        *pSVar5 = auVar8._0_8_;
      }
    }
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool ChOptimizerGenetic::InitializePopulation() {
    int nv = GetNumOfVars();
    int mind;
    int varindex;
    double mvalue, a1, a2;

    if (population == NULL)
        return false;
    if (population[0]->genes.size() != nv)
        return false;

    for (mind = 0; mind < popsize; mind++) {
        varindex = 0;
        population[mind]->need_eval = true;
        for (varindex = 0; varindex < nv; varindex++) {
            a1 = xv_inf[varindex];  // the random value of each variable
            a2 = xv_sup[varindex];  // must lie within the max/min limits
            mvalue = a1 + (ChRandom() * (a2 - a1));
            population[mind]->genes(varindex) = mvalue;
        }
    }

    return true;
}